

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_Dec7PickBestMux(word *t,word *c0r,word *c1r)

{
  int iVar1;
  int iVar2;
  int iVar;
  int iVar3;
  int local_6c;
  word c1 [2];
  word c0 [2];
  
  iVar3 = 1000;
  local_6c = -1;
  for (iVar = 0; iVar != 7; iVar = iVar + 1) {
    If_Dec7Cofactor(t,iVar,0,c0);
    If_Dec7Cofactor(t,iVar,1,c1);
    iVar1 = If_Dec7SuppSize(c0);
    iVar2 = If_Dec7SuppSize(c1);
    if ((iVar2 < 5 && iVar1 < 5) && (iVar2 + iVar1 < iVar3)) {
      *c0r = c0[0];
      c0r[1] = c0[1];
      *c1r = c1[0];
      c1r[1] = c1[1];
      iVar3 = iVar2 + iVar1;
      local_6c = iVar;
    }
  }
  return local_6c;
}

Assistant:

int If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] )
{
    word c0[2], c1[2];
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        Count0 = If_Dec7SuppSize(c0);
        Count1 = If_Dec7SuppSize(c1);
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            c0r[0] = c0[0]; c0r[1] = c0[1];
            c1r[0] = c1[0]; c1r[1] = c1[1];
        }
    }
    return vBest;
}